

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGGrammarPtr_conflict xmlRelaxNGNewGrammar(xmlRelaxNGParserCtxtPtr ctxt)

{
  xmlRelaxNGGrammarPtr_conflict ret;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x40);
  if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
    xmlRngPErrMemory(ctxt,(char *)0x0);
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x40);
  }
  return (xmlRelaxNGGrammarPtr_conflict)ctxt_local;
}

Assistant:

static xmlRelaxNGGrammarPtr
xmlRelaxNGNewGrammar(xmlRelaxNGParserCtxtPtr ctxt)
{
    xmlRelaxNGGrammarPtr ret;

    ret = (xmlRelaxNGGrammarPtr) xmlMalloc(sizeof(xmlRelaxNGGrammar));
    if (ret == NULL) {
        xmlRngPErrMemory(ctxt, NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGGrammar));

    return (ret);
}